

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_frame.cpp
# Opt level: O2

MPP_RET mpp_frame_info_cmp(MppFrame frame0,MppFrame frame1)

{
  MPP_RET MVar1;
  
  MVar1 = _check_is_mpp_frame("mpp_frame_info_cmp",frame0);
  if ((MVar1 == MPP_OK) &&
     (MVar1 = _check_is_mpp_frame("mpp_frame_info_cmp",frame0), MVar1 == MPP_OK)) {
    if ((((*(int *)((long)frame0 + 8) != *(int *)((long)frame1 + 8)) ||
         (*(int *)((long)frame0 + 0xc) != *(int *)((long)frame1 + 0xc))) ||
        (*(int *)((long)frame0 + 0x10) != *(int *)((long)frame1 + 0x10))) ||
       (((*(int *)((long)frame0 + 0x14) != *(int *)((long)frame1 + 0x14) ||
         (((*(uint *)((long)frame1 + 0x68) ^ *(uint *)((long)frame0 + 0x68)) & 0xf3ffffff) != 0)) ||
        (MVar1 = MPP_OK, *(long *)((long)frame0 + 0xa0) != *(long *)((long)frame1 + 0xa0))))) {
      MVar1 = MPP_NOK;
    }
  }
  else {
    _mpp_log_l(2,"mpp_frame","invalid NULL pointer input\n","mpp_frame_info_cmp");
    MVar1 = MPP_ERR_NULL_PTR;
  }
  return MVar1;
}

Assistant:

MPP_RET mpp_frame_info_cmp(MppFrame frame0, MppFrame frame1)
{
    if (check_is_mpp_frame(frame0) || check_is_mpp_frame(frame0)) {
        mpp_err_f("invalid NULL pointer input\n");
        return MPP_ERR_NULL_PTR;
    }

    MppFrameImpl *f0 = (MppFrameImpl *)frame0;
    MppFrameImpl *f1 = (MppFrameImpl *)frame1;

    if ((f0->width              == f1->width)  &&
        (f0->height             == f1->height) &&
        (f0->hor_stride         == f1->hor_stride) &&
        (f0->ver_stride         == f1->ver_stride) &&
        ((f0->fmt & ~MPP_FRAME_HDR_MASK) == (f1->fmt & ~MPP_FRAME_HDR_MASK)) &&
        (f0->buf_size           == f1->buf_size)) {
        return MPP_OK;
    }
    return MPP_NOK;
}